

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_funcdef(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int yythunkpos905;
  int yypos905;
  int yythunkpos903;
  int yypos903;
  int yythunkpos899;
  int yypos899;
  int yythunkpos897;
  int yypos897;
  int yythunkpos896;
  int yypos896;
  int yythunkpos891;
  int yypos891;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,5,0,"yyPush");
  iVar7 = G->pos;
  iVar3 = G->thunkpos;
  iVar5 = yymatchString(G,"my");
  if ((((iVar5 == 0) || (iVar5 = yy_ws(G), iVar5 == 0)) || (iVar5 = yy__(G), iVar5 == 0)) ||
     (iVar5 = yy_funcdef(G), iVar5 == 0)) {
    G->pos = iVar7;
    G->thunkpos = iVar3;
    iVar5 = yymatchString(G,"our");
    if (((iVar5 == 0) || (iVar5 = yy_ws(G), iVar5 == 0)) ||
       ((iVar5 = yy__(G), iVar5 == 0 || (iVar5 = yy_funcdef(G), iVar5 == 0)))) {
      G->pos = iVar7;
      G->thunkpos = iVar3;
      iVar5 = yymatchString(G,"sub");
      if (iVar5 != 0) {
        yyDo(G,yy_3_funcdef,G->begin,G->end,"yy_3_funcdef");
        iVar5 = yy_ws(G);
        if (iVar5 != 0) {
          do {
            iVar5 = G->pos;
            iVar4 = G->thunkpos;
            iVar6 = yy_ws(G);
          } while (iVar6 != 0);
          G->pos = iVar5;
          G->thunkpos = iVar4;
          iVar5 = yy_ident(G);
          if (iVar5 != 0) {
            yyDo(G,yySet,-4,0,"yySet");
            iVar5 = yy__(G);
            if (((iVar5 != 0) && (iVar5 = yymatchChar(G,0x28), iVar5 != 0)) &&
               (iVar5 = yy__(G), iVar5 != 0)) {
              iVar5 = G->pos;
              iVar4 = G->thunkpos;
              iVar6 = yy_params(G);
              if (iVar6 == 0) {
                G->pos = iVar5;
                G->thunkpos = iVar4;
              }
              else {
                yyDo(G,yySet,-3,0,"yySet");
              }
              iVar5 = yy__(G);
              if (((iVar5 != 0) && (iVar5 = yymatchChar(G,0x29), iVar5 != 0)) &&
                 (iVar5 = yy__(G), iVar5 != 0)) {
                iVar5 = G->pos;
                iVar4 = G->thunkpos;
                iVar6 = yy_is_exportable(G);
                if (iVar6 == 0) {
                  G->pos = iVar5;
                  G->thunkpos = iVar4;
                }
                else {
                  yyDo(G,yySet,-2,0,"yySet");
                }
                iVar5 = yy__(G);
                if ((iVar5 != 0) && (iVar5 = yy_block(G), iVar5 != 0)) {
                  yyDo(G,yySet,-1,0,"yySet");
                  yyDo(G,yy_4_funcdef,G->begin,G->end,"yy_4_funcdef");
                  goto LAB_00109211;
                }
              }
            }
          }
        }
      }
      G->pos = iVar7;
      G->thunkpos = iVar3;
      iVar5 = yymatchString(G,"sub");
      if ((iVar5 != 0) && (iVar5 = yy_ws(G), iVar5 != 0)) {
        do {
          iVar5 = G->pos;
          iVar4 = G->thunkpos;
          iVar6 = yy_ws(G);
        } while (iVar6 != 0);
        G->pos = iVar5;
        G->thunkpos = iVar4;
        iVar5 = yy_ident(G);
        if (iVar5 != 0) {
          yyDo(G,yySet,-4,0,"yySet");
          iVar5 = yy__(G);
          if ((iVar5 != 0) && (iVar5 = yy_block(G), iVar5 != 0)) {
            yyDo(G,yySet,-1,0,"yySet");
            yyDo(G,yy_5_funcdef,G->begin,G->end,"yy_5_funcdef");
            goto LAB_00109211;
          }
        }
      }
      G->pos = iVar7;
      G->thunkpos = iVar3;
      iVar7 = yymatchString(G,"multi");
      if ((iVar7 != 0) && (iVar7 = yy_ws(G), iVar7 != 0)) {
        do {
          iVar7 = G->pos;
          iVar3 = G->thunkpos;
          iVar5 = yy_ws(G);
        } while (iVar5 != 0);
        G->pos = iVar7;
        G->thunkpos = iVar3;
        iVar7 = yy_funcdef(G);
        if (iVar7 != 0) {
          yyDo(G,yySet,-5,0,"yySet");
          yyDo(G,yy_6_funcdef,G->begin,G->end,"yy_6_funcdef");
          goto LAB_00109211;
        }
      }
      G->pos = iVar1;
      G->thunkpos = iVar2;
      return 0;
    }
    yyDo(G,yySet,-5,0,"yySet");
    yyDo(G,yy_2_funcdef,G->begin,G->end,"yy_2_funcdef");
  }
  else {
    yyDo(G,yySet,-5,0,"yySet");
    yyDo(G,yy_1_funcdef,G->begin,G->end,"yy_1_funcdef");
  }
LAB_00109211:
  yyDo(G,yyPop,5,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_funcdef(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 5, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "funcdef"));

  {  int yypos891= G->pos, yythunkpos891= G->thunkpos;  if (!yymatchString(G, "my")) goto l892;
  if (!yy_ws(G))  goto l892;
  if (!yy__(G))  goto l892;
  if (!yy_funcdef(G))  goto l892;
  yyDo(G, yySet, -5, 0, "yySet");
  yyDo(G, yy_1_funcdef, G->begin, G->end, "yy_1_funcdef");
  goto l891;
  l892:;	  G->pos= yypos891; G->thunkpos= yythunkpos891;  if (!yymatchString(G, "our")) goto l893;
  if (!yy_ws(G))  goto l893;
  if (!yy__(G))  goto l893;
  if (!yy_funcdef(G))  goto l893;
  yyDo(G, yySet, -5, 0, "yySet");
  yyDo(G, yy_2_funcdef, G->begin, G->end, "yy_2_funcdef");
  goto l891;
  l893:;	  G->pos= yypos891; G->thunkpos= yythunkpos891;  if (!yymatchString(G, "sub")) goto l894;
  yyDo(G, yy_3_funcdef, G->begin, G->end, "yy_3_funcdef");
  if (!yy_ws(G))  goto l894;

  l895:;	
  {  int yypos896= G->pos, yythunkpos896= G->thunkpos;  if (!yy_ws(G))  goto l896;
  goto l895;
  l896:;	  G->pos= yypos896; G->thunkpos= yythunkpos896;
  }  if (!yy_ident(G))  goto l894;
  yyDo(G, yySet, -4, 0, "yySet");
  if (!yy__(G))  goto l894;
  if (!yymatchChar(G, '(')) goto l894;
  if (!yy__(G))  goto l894;

  {  int yypos897= G->pos, yythunkpos897= G->thunkpos;  if (!yy_params(G))  goto l897;
  yyDo(G, yySet, -3, 0, "yySet");
  goto l898;
  l897:;	  G->pos= yypos897; G->thunkpos= yythunkpos897;
  }
  l898:;	  if (!yy__(G))  goto l894;
  if (!yymatchChar(G, ')')) goto l894;
  if (!yy__(G))  goto l894;

  {  int yypos899= G->pos, yythunkpos899= G->thunkpos;  if (!yy_is_exportable(G))  goto l899;
  yyDo(G, yySet, -2, 0, "yySet");
  goto l900;
  l899:;	  G->pos= yypos899; G->thunkpos= yythunkpos899;
  }
  l900:;	  if (!yy__(G))  goto l894;
  if (!yy_block(G))  goto l894;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_4_funcdef, G->begin, G->end, "yy_4_funcdef");
  goto l891;
  l894:;	  G->pos= yypos891; G->thunkpos= yythunkpos891;  if (!yymatchString(G, "sub")) goto l901;
  if (!yy_ws(G))  goto l901;

  l902:;	
  {  int yypos903= G->pos, yythunkpos903= G->thunkpos;  if (!yy_ws(G))  goto l903;
  goto l902;
  l903:;	  G->pos= yypos903; G->thunkpos= yythunkpos903;
  }  if (!yy_ident(G))  goto l901;
  yyDo(G, yySet, -4, 0, "yySet");
  if (!yy__(G))  goto l901;
  if (!yy_block(G))  goto l901;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_5_funcdef, G->begin, G->end, "yy_5_funcdef");
  goto l891;
  l901:;	  G->pos= yypos891; G->thunkpos= yythunkpos891;  if (!yymatchString(G, "multi")) goto l890;
  if (!yy_ws(G))  goto l890;

  l904:;	
  {  int yypos905= G->pos, yythunkpos905= G->thunkpos;  if (!yy_ws(G))  goto l905;
  goto l904;
  l905:;	  G->pos= yypos905; G->thunkpos= yythunkpos905;
  }  if (!yy_funcdef(G))  goto l890;
  yyDo(G, yySet, -5, 0, "yySet");
  yyDo(G, yy_6_funcdef, G->begin, G->end, "yy_6_funcdef");

  }
  l891:;	  yyprintf((stderr, "  ok   funcdef"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 5, 0, "yyPop");
  return 1;
  l890:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "funcdef"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}